

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdialog.cpp
# Opt level: O0

void __thiscall QFontDialogPrivate::retranslateStrings(QFontDialogPrivate *this)

{
  long in_RDI;
  long in_FS_OFFSET;
  int n;
  QString *text;
  char *in_stack_fffffffffffffea8;
  QAbstractButton *this_00;
  QGroupBox *this_01;
  QString *in_stack_fffffffffffffeb8;
  QString *text_00;
  QLabel *in_stack_fffffffffffffec0;
  QLabel *this_02;
  undefined1 local_50 [48];
  QString local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  text = &local_20;
  n = (int)((ulong)*(undefined8 *)(in_RDI + 0x2e0) >> 0x20);
  QFontDialog::tr(in_stack_fffffffffffffea8,(char *)text,n);
  QLabel::setText(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  QString::~QString((QString *)0x794bb2);
  this_00 = *(QAbstractButton **)(in_RDI + 0x2f8);
  this_01 = (QGroupBox *)(local_50 + 0x18);
  QFontDialog::tr((char *)this_00,(char *)text,n);
  QLabel::setText(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  QString::~QString((QString *)0x794c01);
  text_00 = *(QString **)(in_RDI + 0x310);
  this_02 = (QLabel *)local_50;
  QFontDialog::tr((char *)this_00,(char *)text,n);
  QLabel::setText(this_02,text_00);
  QString::~QString((QString *)0x794c50);
  QFontDialog::tr((char *)this_00,(char *)text,n);
  QGroupBox::setTitle(this_01,(QString *)this_00);
  QString::~QString((QString *)0x794c9f);
  QFontDialog::tr((char *)this_00,(char *)text,n);
  QAbstractButton::setText(this_00,text);
  QString::~QString((QString *)0x794cee);
  QFontDialog::tr((char *)this_00,(char *)text,n);
  QAbstractButton::setText(this_00,text);
  QString::~QString((QString *)0x794d3d);
  QFontDialog::tr((char *)this_00,(char *)text,n);
  QGroupBox::setTitle(this_01,(QString *)this_00);
  QString::~QString((QString *)0x794d8c);
  QFontDialog::tr((char *)this_00,(char *)text,n);
  QLabel::setText(this_02,text_00);
  QString::~QString((QString *)0x794dea);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFontDialogPrivate::retranslateStrings()
{
    familyAccel->setText(QFontDialog::tr("&Font"));
    styleAccel->setText(QFontDialog::tr("Font st&yle"));
    sizeAccel->setText(QFontDialog::tr("&Size"));
    effects->setTitle(QFontDialog::tr("Effects"));
    strikeout->setText(QFontDialog::tr("Stri&keout"));
    underline->setText(QFontDialog::tr("&Underline"));
    sample->setTitle(QFontDialog::tr("Sample"));
    writingSystemAccel->setText(QFontDialog::tr("Wr&iting System"));
}